

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

String * __thiscall
kj::PathPtr::toString(String *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  long lVar1;
  String *pSVar2;
  void *pvVar3;
  char *__dest;
  size_t sVar4;
  char *pcVar5;
  undefined7 in_register_00000011;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  void *__src;
  kj *this_00;
  long lVar10;
  ArrayPtr<const_kj::String> *__range1;
  Fault f;
  Fault local_58;
  String *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar8 = CONCAT71(in_register_00000011,absolute) & 0xffffffff;
  sVar7 = (this->parts).size_;
  if (sVar7 == 0) {
    this_00 = (kj *)0x22ab6c;
    if ((byte)uVar8 != 0) {
      this_00 = (kj *)0x234f17;
    }
    str<char_const(&)[2]>
              (__return_storage_ptr__,this_00,(char (*) [2])CONCAT71(in_register_00000011,absolute))
    ;
  }
  else {
    sVar9 = sVar7 - (byte)((byte)uVar8 ^ 1);
    lVar6 = 0;
    do {
      lVar1 = *(long *)((long)&(((this->parts).ptr)->content).size_ + lVar6);
      lVar10 = 0;
      if (lVar1 != 0) {
        lVar10 = lVar1 + -1;
      }
      sVar9 = sVar9 + lVar10;
      lVar6 = lVar6 + 0x18;
    } while (sVar7 * 0x18 != lVar6);
    heapString(__return_storage_ptr__,sVar9);
    pcVar5 = (__return_storage_ptr__->content).ptr;
    sVar7 = (__return_storage_ptr__->content).size_;
    __dest = pcVar5;
    if (sVar7 == 0) {
      __dest = (char *)0x0;
    }
    sVar9 = (this->parts).size_;
    if (sVar9 != 0) {
      pSVar2 = (this->parts).ptr;
      lVar6 = 0;
      local_50 = __return_storage_ptr__;
      do {
        if ((uVar8 & 1) != 0) {
          *__dest = '/';
          __dest = __dest + 1;
        }
        pvVar3 = *(void **)((long)&(pSVar2->content).size_ + lVar6);
        __src = pvVar3;
        if (pvVar3 != (void *)0x0) {
          __src = *(void **)((long)&(pSVar2->content).ptr + lVar6);
        }
        sVar4 = (long)pvVar3 - 1;
        if (pvVar3 == (void *)0x0) {
          sVar4 = 0;
        }
        memcpy(__dest,__src,sVar4);
        lVar1 = *(long *)((long)&(pSVar2->content).size_ + lVar6);
        sVar4 = lVar1 - 1;
        if (lVar1 == 0) {
          sVar4 = 0;
        }
        __dest = __dest + sVar4;
        lVar6 = lVar6 + 0x18;
        uVar8 = 1;
      } while (sVar9 * 0x18 != lVar6);
      pcVar5 = (local_50->content).ptr;
      sVar7 = (local_50->content).size_;
      __return_storage_ptr__ = local_50;
    }
    pcVar5 = pcVar5 + (sVar7 - 1);
    if (sVar7 == 0) {
      pcVar5 = (char *)0x0;
    }
    if (__dest != pcVar5) {
      local_58.exception = (Exception *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      _::Debug::Fault::init
                (&local_58,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                );
      _::Debug::Fault::fatal(&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}